

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_ManDfsReverse(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
  }
  iVar1 = Aig_ManNodeNum(p);
  vNodes_00 = Vec_PtrAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pAVar2 != (Aig_Obj_t *)0x0) &&
       ((iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0 || (iVar1 = Aig_ObjIsBuf(pAVar2), iVar1 != 0))))
    {
      Aig_ManDfsReverse_rec(p,pAVar2,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsReverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) )
            Aig_ManDfsReverse_rec( p, pObj, vNodes );
    return vNodes;
}